

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTests.cpp
# Opt level: O0

void vkt::texture::anon_unknown_1::createTextureTests(TestCaseGroup *textureTests)

{
  TestContext *testCtx_00;
  TestNode *pTVar1;
  TestContext *testCtx;
  TestCaseGroup *textureTests_local;
  
  testCtx_00 = tcu::TestNode::getTestContext(&textureTests->super_TestNode);
  pTVar1 = &createTextureFilteringTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  pTVar1 = &createTextureMipmappingTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  pTVar1 = &createExplicitLodTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  pTVar1 = &createTextureShadowTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  pTVar1 = &createFilteringAnisotropyTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  pTVar1 = &createTextureCompressedFormatTests(testCtx_00)->super_TestNode;
  tcu::TestNode::addChild(&textureTests->super_TestNode,pTVar1);
  return;
}

Assistant:

void createTextureTests (tcu::TestCaseGroup* textureTests)
{
	tcu::TestContext&	testCtx	= textureTests->getTestContext();

	textureTests->addChild(createTextureFilteringTests			(testCtx));
	textureTests->addChild(createTextureMipmappingTests			(testCtx));
	textureTests->addChild(createExplicitLodTests				(testCtx));
	textureTests->addChild(createTextureShadowTests				(testCtx));
	textureTests->addChild(createFilteringAnisotropyTests		(testCtx));
	textureTests->addChild(createTextureCompressedFormatTests	(testCtx));
}